

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O2

void __thiscall Data<3U>::Data(Data<3U> *this)

{
  ostream *poVar1;
  
  this->_data = 0;
  (*(code *)es::init::
            singleton<es::init::std_init,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  poVar1 = std::operator<<((ostream *)&std::cout,"Data::ctor ");
  poVar1 = std::operator<<(poVar1,"Data<3>::Data() [V = 3]");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

Data()
    {
        es::init::singleton<es::init::std_init>::instance();
        //  [[ using gnu : used ]]
        //  static auto & init /* __attribute__((used)) */ {es::init::singleton<es::init::std_init>::instance()};

        std::cout << "Data::ctor " << __PRETTY_FUNCTION__ << std::endl;
    }